

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

double TasGrid::Optimizer::getNextNode<(TasGrid::TypeOneDRule)15>
                 (vector<double,_std::allocator<double>_> *nodes)

{
  OptimizerResult OVar1;
  CurrentNodes<(TasGrid::TypeOneDRule)15> local_38;
  
  CurrentNodes<(TasGrid::TypeOneDRule)15>::CurrentNodes(&local_38,nodes);
  OVar1 = computeMaximum<(TasGrid::TypeOneDRule)15>(&local_38);
  if (local_38.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_38.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return OVar1.node;
}

Assistant:

double getNextNode(std::vector<double> const &nodes){
    return computeMaximum(CurrentNodes<rule>(nodes)).node;
}